

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::ChooseConfigCase::executeTest
          (ChooseConfigCase *this,
          vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
          *attributes,bool checkOrder)

{
  EGLDisplay *egl;
  int iVar1;
  TestLog *pTVar2;
  pair<unsigned_int,_int> pVar3;
  bool bVar4;
  deUint32 dVar5;
  EGLint EVar6;
  EGLint EVar7;
  _anonymous_namespace_ *this_00;
  char *__s;
  pointer ppvVar8;
  pointer ppvVar9;
  long lVar10;
  vector<void_*,_std::allocator<void_*>_> *configs;
  pointer ppVar11;
  int configNdx;
  long lVar12;
  bool bVar13;
  vector<void_*,_std::allocator<void_*>_> resultConfigs;
  vector<void_*,_std::allocator<void_*>_> referenceConfigs;
  string attribStr;
  vector<int,_std::allocator<int>_> attribList;
  EGLint numConfigs;
  undefined4 uStack_1ac;
  ostringstream local_1a8 [376];
  
  this_00 = (_anonymous_namespace_ *)EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx)
  ;
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  attribList.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  attribList.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  attribList.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  for (ppVar11 = (attributes->
                 super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      ppVar11 !=
      (attributes->
      super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish; ppVar11 = ppVar11 + 1) {
    _numConfigs = (TestLog *)CONCAT44(uStack_1ac,ppVar11->first);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,&numConfigs);
    std::vector<int,_std::allocator<int>_>::push_back(&attribList,&ppVar11->second);
  }
  _numConfigs = (TestLog *)CONCAT44(uStack_1ac,0x3038);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribList,&numConfigs);
  _numConfigs = pTVar2;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Attributes:");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&numConfigs,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  for (ppVar11 = (attributes->
                 super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      ppVar11 !=
      (attributes->
      super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish; ppVar11 = ppVar11 + 1) {
    iVar1 = ppVar11->second;
    pVar3 = *ppVar11;
    __s = eglu::getConfigAttribName(ppVar11->first);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&attribStr,__s,(allocator<char> *)&numConfigs);
    if (iVar1 == -1) {
      _numConfigs = pTVar2;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,"  ");
      std::operator<<((ostream *)local_1a8,(string *)&attribStr);
      std::operator<<((ostream *)local_1a8,": EGL_DONT_CARE");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&numConfigs,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
    }
    else {
      _numConfigs = pTVar2;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,"  ");
      std::operator<<((ostream *)local_1a8,(string *)&attribStr);
      std::operator<<((ostream *)local_1a8,": ");
      resultConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pVar3;
      eglu::operator<<((ostream *)local_1a8,(ConfigAttribValueFmt *)&resultConfigs);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&numConfigs,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
    }
    std::__cxx11::string::~string((string *)&attribStr);
  }
  resultConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  resultConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  resultConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  referenceConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _numConfigs = (TestLog *)((ulong)_numConfigs & 0xffffffff00000000);
  referenceConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  referenceConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  configs = (vector<void_*,_std::allocator<void_*>_> *)0x0;
  (**(code **)(*(long *)this_00 + 0x10))
            (this_00,this->m_display,
             attribList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  dVar5 = (**(code **)(*(long *)this_00 + 0xf8))(this_00);
  eglu::checkError(dVar5,"chooseConfig(m_display, &attribList[0], DE_NULL, 0, &numConfigs)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigTests.cpp"
                   ,0xba);
  std::vector<void_*,_std::allocator<void_*>_>::resize(&resultConfigs,(long)numConfigs);
  egl = &this->m_display;
  if (0 < numConfigs) {
    configs = (vector<void_*,_std::allocator<void_*>_> *)
              ((ulong)((long)resultConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)resultConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3);
    (**(code **)(*(long *)this_00 + 0x10))
              (this_00,*egl,
               attribList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               resultConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_start,configs,&numConfigs);
    dVar5 = (**(code **)(*(long *)this_00 + 0xf8))(this_00);
    eglu::checkError(dVar5,
                     "chooseConfig(m_display, &attribList[0], &resultConfigs[0], (EGLint)resultConfigs.size(), &numConfigs)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigTests.cpp"
                     ,0xbe);
  }
  chooseConfigReference((Library *)this_00,*egl,&referenceConfigs,attributes);
  _numConfigs = pTVar2;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Expected:\n  ");
  egl::(anonymous_namespace)::configListToString_abi_cxx11_
            (&attribStr,this_00,(Library *)egl,(EGLDisplay *)&referenceConfigs,configs);
  std::operator<<((ostream *)local_1a8,(string *)&attribStr);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&numConfigs,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&attribStr);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  _numConfigs = pTVar2;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Got:\n  ");
  egl::(anonymous_namespace)::configListToString_abi_cxx11_
            (&attribStr,this_00,(Library *)egl,(EGLDisplay *)&resultConfigs,configs);
  std::operator<<((ostream *)local_1a8,(string *)&attribStr);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&numConfigs,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&attribStr);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::set<void*,std::less<void*>,std::allocator<void*>>::
  set<__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>>
            ((set<void*,std::less<void*>,std::allocator<void*>> *)&numConfigs,
             (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
             resultConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
             resultConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::set<void*,std::less<void*>,std::allocator<void*>>::
  set<__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>>
            ((set<void*,std::less<void*>,std::allocator<void*>> *)&attribStr,
             (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
             referenceConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
             referenceConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  bVar4 = std::operator==((_Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
                           *)&numConfigs,
                          (_Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
                           *)&attribStr);
  std::_Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
  ::~_Rb_tree((_Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
               *)&attribStr);
  std::_Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
  ::~_Rb_tree((_Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
               *)&numConfigs);
  bVar13 = true;
  if ((long)resultConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)resultConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)referenceConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)referenceConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
    ppvVar8 = resultConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppvVar9 = resultConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (lVar12 = 0; lVar10 = (long)(int)((ulong)((long)ppvVar9 - (long)ppvVar8) >> 3),
        bVar13 = lVar12 < lVar10, lVar12 < lVar10; lVar12 = lVar12 + 1) {
      if (ppvVar8[lVar12] !=
          referenceConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start[lVar12]) {
        EVar6 = eglu::getConfigAttribInt((Library *)this_00,*egl,ppvVar8[lVar12],0x3027);
        EVar7 = eglu::getConfigAttribInt
                          ((Library *)this_00,*egl,
                           referenceConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar12],0x3027);
        if ((EVar6 != 0x3051) ||
           (ppvVar8 = resultConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
           ppvVar9 = resultConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                     super__Vector_impl_data._M_finish, EVar7 != 0x3051)) break;
      }
    }
  }
  if (bVar4) {
    if ((checkOrder & bVar13) == 0) {
      _numConfigs = pTVar2;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,"Pass");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&numConfigs,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      goto LAB_00debdbd;
    }
    _numConfigs = pTVar2;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,"Fail, got correct configs but in invalid order");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&numConfigs,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    _numConfigs = pTVar2;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,"Fail, configs don\'t match");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&numConfigs,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             "Fail");
LAB_00debdbd:
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            (&referenceConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            (&resultConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&attribList.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void executeTest (const std::vector<std::pair<EGLenum, EGLint> >& attributes, bool checkOrder)
	{
		const Library&	egl	= m_eglTestCtx.getLibrary();
		TestLog&		log	= m_testCtx.getLog();

		// Build attributes for EGL
		vector<EGLint> attribList;
		for (vector<pair<EGLenum, EGLint> >::const_iterator i = attributes.begin(); i != attributes.end(); i++)
		{
			attribList.push_back(i->first);
			attribList.push_back(i->second);
		}
		attribList.push_back(EGL_NONE);

		// Print attribList to log
		log << TestLog::Message << "Attributes:" << TestLog::EndMessage;
		for (vector<pair<EGLenum, EGLint> >::const_iterator i = attributes.begin(); i != attributes.end(); i++)
			logConfigAttrib(log, i->first, i->second);

		std::vector<EGLConfig>	resultConfigs;
		std::vector<EGLConfig>	referenceConfigs;

		// Query from EGL implementation
		{
			EGLint numConfigs = 0;
			EGLU_CHECK_CALL(egl, chooseConfig(m_display, &attribList[0], DE_NULL, 0, &numConfigs));
			resultConfigs.resize(numConfigs);

			if (numConfigs > 0)
				EGLU_CHECK_CALL(egl, chooseConfig(m_display, &attribList[0], &resultConfigs[0], (EGLint)resultConfigs.size(), &numConfigs));
		}

		// Build reference
		chooseConfigReference(egl, m_display, referenceConfigs, attributes);

		log << TestLog::Message << "Expected:\n  " << configListToString(egl, m_display, referenceConfigs) << TestLog::EndMessage;
		log << TestLog::Message << "Got:\n  " << configListToString(egl, m_display, resultConfigs) << TestLog::EndMessage;

		bool isSetMatch		= (set<EGLConfig>(resultConfigs.begin(), resultConfigs.end()) == set<EGLConfig>(referenceConfigs.begin(), referenceConfigs.end()));
		bool isExactMatch	= configListEqual(egl, m_display, resultConfigs, referenceConfigs);
		bool isMatch		= isSetMatch && (checkOrder ? isExactMatch : true);

		if (isMatch)
			log << TestLog::Message << "Pass" << TestLog::EndMessage;
		else if (!isSetMatch)
			log << TestLog::Message << "Fail, configs don't match" << TestLog::EndMessage;
		else if (!isExactMatch)
			log << TestLog::Message << "Fail, got correct configs but in invalid order" << TestLog::EndMessage;

		if (!isMatch)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}